

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

bool crnlib::command_line_params::split_params(char *p,dynamic_string_array *params)

{
  char c_00;
  bool bVar1;
  undefined1 local_38 [7];
  char c;
  dynamic_string str;
  uint ofs;
  bool within_quote;
  bool within_param;
  dynamic_string_array *params_local;
  char *p_local;
  
  str.m_pStr._7_1_ = 0;
  str.m_pStr._6_1_ = 0;
  str.m_pStr._0_4_ = 0;
  dynamic_string::dynamic_string((dynamic_string *)local_38);
  for (; p[(uint)str.m_pStr] != '\0'; str.m_pStr._0_4_ = (uint)str.m_pStr + 1) {
    c_00 = p[(uint)str.m_pStr];
    if ((str.m_pStr._7_1_ & 1) == 0) {
      if ((c_00 != ' ') && (c_00 != '\t')) {
        str.m_pStr._7_1_ = 1;
        if (c_00 == '\"') {
          str.m_pStr._6_1_ = 1;
        }
        dynamic_string::append_char((dynamic_string *)local_38,c_00);
      }
    }
    else if ((str.m_pStr._6_1_ & 1) == 0) {
      if ((c_00 == ' ') || (c_00 == '\t')) {
        bVar1 = dynamic_string::is_empty((dynamic_string *)local_38);
        if (!bVar1) {
          vector<crnlib::dynamic_string>::push_back(params,(dynamic_string *)local_38);
          dynamic_string::clear((dynamic_string *)local_38);
        }
        str.m_pStr._7_1_ = 0;
      }
      else {
        if (c_00 == '\"') {
          str.m_pStr._6_1_ = 1;
        }
        dynamic_string::append_char((dynamic_string *)local_38,c_00);
      }
    }
    else {
      if (c_00 == '\"') {
        str.m_pStr._6_1_ = 0;
      }
      dynamic_string::append_char((dynamic_string *)local_38,c_00);
    }
  }
  if ((str.m_pStr._6_1_ & 1) == 0) {
    bVar1 = dynamic_string::is_empty((dynamic_string *)local_38);
    if (!bVar1) {
      vector<crnlib::dynamic_string>::push_back(params,(dynamic_string *)local_38);
    }
    p_local._7_1_ = true;
  }
  else {
    console::error("Unmatched quote in command line \"%s\"",p);
    p_local._7_1_ = false;
  }
  dynamic_string::~dynamic_string((dynamic_string *)local_38);
  return p_local._7_1_;
}

Assistant:

bool command_line_params::split_params(const char* p, dynamic_string_array& params)
    {
        bool within_param = false;
        bool within_quote = false;

        uint ofs = 0;
        dynamic_string str;

        while (p[ofs])
        {
            const char c = p[ofs];

            if (within_param)
            {
                if (within_quote)
                {
                    if (c == '"')
                    {
                        within_quote = false;
                    }
                    str.append_char(c);
                }
                else if ((c == ' ') || (c == '\t'))
                {
                    if (!str.is_empty())
                    {
                        params.push_back(str);
                        str.clear();
                    }
                    within_param = false;
                }
                else
                {
                    if (c == '"')
                    {
                        within_quote = true;
                    }
                    str.append_char(c);
                }
            }
            else if ((c != ' ') && (c != '\t'))
            {
                within_param = true;

                if (c == '"')
                {
                    within_quote = true;
                }

                str.append_char(c);
            }

            ofs++;
        }

        if (within_quote)
        {
            console::error("Unmatched quote in command line \"%s\"", p);
            return false;
        }

        if (!str.is_empty())
        {
            params.push_back(str);
        }
        return true;
    }